

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_doctype<0>(xml_document<char> *this,char **text)

{
  char cVar1;
  parse_error *ppVar2;
  int local_24;
  int depth;
  char *value;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    if (**text == '>') {
      *text = *text + 1;
      return (xml_node<char> *)0x0;
    }
    if (**text == '\0') break;
    if (**text == '[') {
      *text = *text + 1;
      local_24 = 1;
      while (0 < local_24) {
        cVar1 = **text;
        if (cVar1 == '\0') {
          ppVar2 = (parse_error *)__cxa_allocate_exception(0x18);
          parse_error::parse_error(ppVar2,"unexpected end of data",*text);
          __cxa_throw(ppVar2,&parse_error::typeinfo,parse_error::~parse_error);
        }
        if (cVar1 == '[') {
          local_24 = local_24 + 1;
        }
        else if (cVar1 == ']') {
          local_24 = local_24 + -1;
        }
        *text = *text + 1;
      }
    }
    else {
      *text = *text + 1;
    }
  }
  ppVar2 = (parse_error *)__cxa_allocate_exception(0x18);
  parse_error::parse_error(ppVar2,"unexpected end of data",*text);
  __cxa_throw(ppVar2,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

xml_node<Ch> *parse_doctype(Ch *&text)
        {
            // Remember value start
            Ch *value = text;

            // Skip to >
            while (*text != Ch('>'))
            {
                // Determine character type
                switch (*text)
                {

                // If '[' encountered, scan for matching ending ']' using naive algorithm with depth
                // This works for all W3C test files except for 2 most wicked
                case Ch('['):
                {
                    ++text;     // Skip '['
                    int depth = 1;
                    while (depth > 0)
                    {
                        switch (*text)
                        {
                            case Ch('['): ++depth; break;
                            case Ch(']'): --depth; break;
                            case 0: RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                        }
                        ++text;
                    }
                    break;
                }

                // Error on end of text
                case Ch('\0'):
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);

                // Other character, skip it
                default:
                    ++text;

                }
            }

            // If DOCTYPE nodes enabled
            if (Flags & parse_doctype_node)
            {
                // Create a new doctype node
                xml_node<Ch> *doctype = this->allocate_node(node_doctype);
                doctype->value(value, text - value);

                // Place zero terminator after value
                if (!(Flags & parse_no_string_terminators))
                    *text = Ch('\0');

                text += 1;      // skip '>'
                return doctype;
            }
            else
            {
                text += 1;      // skip '>'
                return 0;
            }

        }